

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O3

bool rr::LineRasterUtil::doesLineSegmentExitDiamond
               (SubpixelLineSegment *line,Vector<long,_2> *diamondCenter)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  char cVar6;
  char cVar7;
  bool bVar8;
  byte bVar9;
  ulong uVar10;
  long lVar11;
  byte *pbVar12;
  long lVar13;
  long lVar14;
  long sqSum;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  int ndx;
  long lVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  DiamondCorners corners [4];
  Vector<long,_2> res;
  Vector<long,_2> local_158;
  char local_148 [4];
  int local_144 [7];
  undefined1 local_128;
  undefined8 local_124;
  undefined4 local_11c;
  undefined8 local_118;
  undefined8 local_110;
  undefined1 local_108;
  undefined8 local_104;
  undefined4 local_fc;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined1 local_e8;
  undefined8 local_e4;
  undefined4 local_dc;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  byte local_b8 [8];
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  undefined1 local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  undefined1 local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  undefined1 local_40;
  
  lVar2 = (line->m_v1).m_data[0];
  lVar3 = (line->m_v0).m_data[0];
  lVar4 = (line->m_v0).m_data[1];
  uVar10 = lVar2 - lVar3;
  lVar5 = (line->m_v1).m_data[1];
  uVar22 = lVar5 - lVar4;
  local_d8 = diamondCenter->m_data[0];
  local_c0 = diamondCenter->m_data[1];
  lVar13 = (lVar3 - local_d8) * uVar22 + (local_c0 - lVar4) * uVar10;
  uVar15 = 0;
  uVar18 = uVar10;
  bVar8 = true;
  do {
    bVar26 = bVar8;
    uVar15 = uVar15 + uVar18 * uVar18;
    uVar18 = uVar22;
    bVar8 = false;
  } while (bVar26);
  uVar18 = uVar15 >> 0x2e;
  if ((uVar18 == 0) && (lVar13 - 0xb504f334U < 0xfffffffe95f61999)) {
    bVar8 = false;
  }
  else {
    lVar16 = uVar15 * 0x10000;
    bVar8 = false;
    if (uVar18 != 0) {
      lVar16 = 0;
    }
    if (((lVar13 - 0xb504f334U < 0xfffffffe95f61999) || (uVar18 != 0)) ||
       (lVar13 * lVar13 <= lVar16)) {
      local_d0 = local_c0 + -0x80;
      local_c8 = local_d8 + -0x80;
      lVar23 = 0;
      local_b8[0] = 0;
      local_b0 = local_d8 + -0x80;
      local_a8 = local_c0;
      local_a0 = local_d8;
      local_98 = local_c0 + 0x80;
      local_90 = 0;
      local_88 = local_d8;
      local_80 = local_c0 + 0x80;
      local_78 = local_d8 + 0x80;
      local_70 = local_c0;
      local_68 = 1;
      local_60 = local_d8 + 0x80;
      local_58 = local_c0;
      local_50 = local_d8;
      local_48 = local_c0 + -0x80;
      local_40 = 1;
      local_158.m_data[0] = 0;
      local_158.m_data[1] = -0x80;
      local_148[0] = '\0';
      local_144[0] = 3;
      local_144[1] = 2;
      local_144[2] = 3;
      local_144[3] = -0x80;
      local_144[4] = -1;
      local_144[5] = 0;
      local_144[6] = 0;
      local_128 = 0;
      local_124 = 0;
      local_11c = 1;
      local_118 = 0;
      local_110 = 0x80;
      local_108 = 0;
      local_104 = 0x300000002;
      local_fc = 2;
      local_f8 = 0x80;
      local_f0 = 0;
      local_e8 = 1;
      local_e4 = 0x100000001;
      local_dc = 0;
      lVar13 = diamondCenter->m_data[0];
      lVar16 = diamondCenter->m_data[1];
      do {
        lVar19 = (&local_158)[lVar23 * 2].m_data[0] + lVar13;
        lVar21 = *(long *)(local_148 + lVar23 * 0x20 + -8) + lVar16;
        if (((lVar21 - lVar4) * uVar10 - (lVar19 - lVar3) * uVar22 == 0) &&
           (uVar22 != 0 || uVar10 != 0)) {
          lVar17 = 0;
          lVar11 = lVar19 - lVar3;
          uVar18 = uVar10;
          bVar8 = true;
          do {
            bVar26 = bVar8;
            lVar17 = lVar17 + lVar11 * uVar18;
            lVar11 = lVar21 - lVar4;
            uVar18 = uVar22;
            bVar8 = false;
          } while (bVar26);
          if (-1 < lVar17) {
            lVar17 = 0;
            lVar11 = lVar2 - lVar19;
            uVar18 = uVar10;
            bVar8 = true;
            do {
              bVar26 = bVar8;
              lVar17 = lVar17 + uVar18 * lVar11;
              lVar11 = lVar5 - lVar21;
              uVar18 = uVar22;
              bVar8 = false;
            } while (bVar26);
            if (-1 < lVar17) {
              bVar8 = true;
              lVar17 = 0;
              lVar11 = lVar19;
              do {
                lVar14 = lVar11;
                lVar20 = (line->m_v0).m_data[lVar17];
                if (!bVar8) break;
                lVar17 = 1;
                bVar8 = false;
                lVar11 = lVar21;
              } while (lVar14 == lVar20);
              if (lVar14 != lVar20) {
                bVar8 = true;
                lVar17 = 0;
                lVar11 = lVar19;
                do {
                  lVar14 = lVar11;
                  lVar20 = (line->m_v1).m_data[lVar17];
                  if (!bVar8) break;
                  lVar17 = 1;
                  bVar8 = false;
                  lVar11 = lVar21;
                } while (lVar14 == lVar20);
                if (lVar14 != lVar20) {
                  iVar1 = local_144[lVar23 * 8];
                  if (iVar1 == 2) {
                    if ((long)(uVar22 * uVar10) < 1) {
                      return true;
                    }
                  }
                  else if (iVar1 == 3) {
                    if (0 < (long)(uVar22 * uVar10)) {
                      return true;
                    }
                  }
                  else if (iVar1 == 1) {
                    return true;
                  }
                }
              }
              bVar8 = lineInCornerAngleRange(line,&local_158 + lVar23 * 2);
              if (bVar8) {
                if (local_148[lVar23 * 0x20] == '\0') {
                  bVar26 = true;
                  lVar17 = 0;
                  lVar11 = lVar19;
                  do {
                    lVar20 = (line->m_v0).m_data[lVar17];
                    bVar24 = lVar11 == lVar20;
                    if (!bVar26) break;
                    lVar17 = 1;
                    bVar26 = false;
                    bVar25 = lVar11 == lVar20;
                    lVar11 = lVar21;
                  } while (bVar25);
                }
                else {
                  bVar26 = true;
                  lVar17 = 0;
                  lVar11 = lVar19;
                  do {
                    lVar20 = (line->m_v1).m_data[lVar17];
                    bVar24 = lVar11 == lVar20;
                    if (!bVar26) break;
                    lVar17 = 1;
                    bVar26 = false;
                    bVar25 = lVar11 == lVar20;
                    lVar11 = lVar21;
                  } while (bVar25);
                }
                if (!bVar24) {
                  return true;
                }
              }
              bVar26 = true;
              lVar17 = 0;
              lVar11 = lVar19;
              do {
                lVar14 = lVar11;
                lVar20 = (line->m_v1).m_data[lVar17];
                if (!bVar26) break;
                lVar17 = 1;
                bVar26 = false;
                lVar11 = lVar21;
              } while (lVar14 == lVar20);
              if ((lVar14 == lVar20) && (iVar1 = local_144[lVar23 * 8 + 2], iVar1 - 1U < 3)) {
                if (bVar8) {
                  return true;
                }
                bVar8 = 0 < (long)uVar10;
                if (((iVar1 == 3) || (bVar8 = (long)uVar10 < 0, iVar1 == 2)) &&
                   (bVar8 && 0 < (long)uVar22)) {
                  return true;
                }
              }
              bVar8 = true;
              lVar11 = 0;
              do {
                lVar20 = lVar19;
                lVar17 = (line->m_v0).m_data[lVar11];
                if (!bVar8) break;
                lVar11 = 1;
                bVar8 = false;
                lVar19 = lVar21;
              } while (lVar20 == lVar17);
              if (lVar20 == lVar17) {
                iVar1 = local_144[lVar23 * 8 + 1];
                if (iVar1 == 3) {
                  if ((0 >= (long)uVar22 && 0 < (long)uVar10) &&
                      SBORROW8(uVar10,-uVar22) == (long)(uVar10 + uVar22) < 0) {
                    return true;
                  }
                }
                else if (iVar1 == 2) {
                  if (uVar22 <= uVar10 && (0 < (long)uVar22 && 0 < (long)uVar10)) {
                    return true;
                  }
                }
                else if ((iVar1 == 1) &&
                        (bVar8 = lineInCornerOutsideAngleRange(line,&local_158 + lVar23 * 2), bVar8)
                        ) {
                  return true;
                }
              }
            }
          }
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 != 4);
      bVar8 = true;
      pbVar12 = local_b8;
      uVar18 = 0;
      do {
        lVar13 = *(long *)(pbVar12 + -0x20);
        lVar16 = *(long *)(pbVar12 + -0x18);
        lVar23 = *(long *)(pbVar12 + -8);
        lVar21 = *(long *)(pbVar12 + -0x10) - lVar13;
        lVar19 = (lVar4 - lVar16) * lVar21;
        if ((lVar16 - lVar23) * (lVar3 - lVar13) + lVar19 < 0) {
          bVar26 = false;
        }
        else {
          bVar26 = true;
          if (*pbVar12 == 1) {
            bVar26 = lVar19 - (lVar23 - lVar16) * (lVar3 - lVar13) != 0;
          }
        }
        lVar21 = ((line->m_v1).m_data[1] - lVar16) * lVar21;
        if ((-1 < (lVar16 - lVar23) * (lVar2 - lVar13) + lVar21) &&
           (!bVar26 && (lVar21 - (lVar23 - lVar16) * (lVar2 - lVar13) == 0 & *pbVar12) == 0)) {
          lVar23 = (lVar23 - lVar4) * uVar10;
          lVar19 = (*(long *)(pbVar12 + -0x10) - lVar3) * (lVar4 - lVar5);
          lVar21 = lVar19 + lVar23;
          cVar6 = (lVar23 + lVar19 != 0) * '\x02';
          if (lVar21 < 0) {
            cVar6 = '\x01';
          }
          lVar23 = (lVar16 - lVar4) * uVar10;
          lVar13 = (lVar13 - lVar3) * (lVar4 - lVar5);
          lVar16 = lVar13 + lVar23;
          cVar7 = (lVar23 + lVar13 != 0) * '\x02';
          if (lVar16 < 0) {
            cVar7 = '\x01';
          }
          if (((lVar16 != 0) && (lVar21 != 0)) && (cVar7 != cVar6)) {
            bVar9 = 1;
            goto LAB_00500a6b;
          }
        }
        bVar8 = uVar18 < 3;
        uVar18 = uVar18 + 1;
        pbVar12 = pbVar12 + 0x28;
      } while (uVar18 != 4);
      bVar9 = 0;
LAB_00500a6b:
      bVar8 = (bool)(bVar8 & bVar9);
    }
  }
  return bVar8;
}

Assistant:

bool doesLineSegmentExitDiamond (const SubpixelLineSegment& line, const tcu::Vector<deInt64,2>& diamondCenter)
{
	DE_ASSERT(isTheCenterOfTheFragment(diamondCenter));

	// Diamond Center is at diamondCenter in subpixel coords

	const deInt64 halfPixel = 1ll << (RASTERIZER_SUBPIXEL_BITS-1);

	// Reject distant diamonds early
	{
		const tcu::Vector<deInt64,2>	u				= line.direction();
		const tcu::Vector<deInt64,2>	v				= (diamondCenter - line.m_v0);
		const deInt64					crossProduct	= (u.x() * v.y() - u.y() * v.x());

		// crossProduct = |p| |l| sin(theta)
		// distanceFromLine = |p| sin(theta)
		// => distanceFromLine = crossProduct / |l|
		//
		// |distanceFromLine| > C
		// => distanceFromLine^2 > C^2
		// => crossProduct^2 / |l|^2 > C^2
		// => crossProduct^2 > |l|^2 * C^2

		const deInt64	floorSqrtMaxInt64			= 3037000499LL; //!< floor(sqrt(MAX_INT64))

		const deInt64	broadRejectDistance			= 2 * halfPixel;
		const deInt64	broadRejectDistanceSquared	= broadRejectDistance * broadRejectDistance;
		const bool		crossProductOverflows		= (crossProduct > floorSqrtMaxInt64 || crossProduct < -floorSqrtMaxInt64);
		const deInt64	crossProductSquared			= (crossProductOverflows) ? (0) : (crossProduct * crossProduct); // avoid overflow
		const deInt64	lineLengthSquared			= tcu::lengthSquared(u);
		const bool		limitValueCouldOverflow		= ((64 - deClz64(lineLengthSquared)) + (64 - deClz64(broadRejectDistanceSquared))) > 63;
		const deInt64	limitValue					= (limitValueCouldOverflow) ? (0) : (lineLengthSquared * broadRejectDistanceSquared); // avoid overflow

		// only cross overflows
		if (crossProductOverflows && !limitValueCouldOverflow)
			return false;

		// both representable
		if (!crossProductOverflows && !limitValueCouldOverflow)
		{
			if (crossProductSquared > limitValue)
				return false;
		}
	}

	const struct DiamondBound
	{
		tcu::Vector<deInt64,2>	p0;
		tcu::Vector<deInt64,2>	p1;
		bool					edgeInclusive; // would a point on the bound be inside of the region
	} bounds[] =
	{
		{ diamondCenter + tcu::Vector<deInt64,2>(0,				-halfPixel),	diamondCenter + tcu::Vector<deInt64,2>(-halfPixel,	0),				 false	},
		{ diamondCenter + tcu::Vector<deInt64,2>(-halfPixel,	0),				diamondCenter + tcu::Vector<deInt64,2>(0,			halfPixel),		 false	},
		{ diamondCenter + tcu::Vector<deInt64,2>(0,				halfPixel),		diamondCenter + tcu::Vector<deInt64,2>(halfPixel,	0),				 true	},
		{ diamondCenter + tcu::Vector<deInt64,2>(halfPixel,		0),				diamondCenter + tcu::Vector<deInt64,2>(0,			-halfPixel),	 true	},
	};

	const struct DiamondCorners
	{
		enum CORNER_EDGE_CASE_BEHAVIOR
		{
			CORNER_EDGE_CASE_NONE,							// if the line intersects just a corner, no entering or exiting
			CORNER_EDGE_CASE_HIT,							// if the line intersects just a corner, entering and exit
			CORNER_EDGE_CASE_HIT_FIRST_QUARTER,				// if the line intersects just a corner and the line has either endpoint in (+X,-Y) direction (preturbing moves the line inside)
			CORNER_EDGE_CASE_HIT_SECOND_QUARTER				// if the line intersects just a corner and the line has either endpoint in (+X,+Y) direction (preturbing moves the line inside)
		};
		enum CORNER_START_CASE_BEHAVIOR
		{
			CORNER_START_CASE_NONE,							// the line starting point is outside, no exiting
			CORNER_START_CASE_OUTSIDE,						// exit, if line does not intersect the region (preturbing moves the start point inside)
			CORNER_START_CASE_POSITIVE_Y_45,				// exit, if line the angle of line vector and X-axis is in range (0, 45] in positive Y side.
			CORNER_START_CASE_NEGATIVE_Y_45					// exit, if line the angle of line vector and X-axis is in range [0, 45] in negative Y side.
		};
		enum CORNER_END_CASE_BEHAVIOR
		{
			CORNER_END_CASE_NONE,							// end is inside, no exiting (preturbing moves the line end inside)
			CORNER_END_CASE_DIRECTION,						// exit, if line intersected the region (preturbing moves the line end outside)
			CORNER_END_CASE_DIRECTION_AND_FIRST_QUARTER,	// exit, if line intersected the region, or line originates from (+X,-Y) direction (preturbing moves the line end outside)
			CORNER_END_CASE_DIRECTION_AND_SECOND_QUARTER	// exit, if line intersected the region, or line originates from (+X,+Y) direction (preturbing moves the line end outside)
		};

		tcu::Vector<deInt64,2>		dp;
		bool						pointInclusive;			// would a point in this corner intersect with the region
		CORNER_EDGE_CASE_BEHAVIOR	lineBehavior;			// would a line segment going through this corner intersect with the region
		CORNER_START_CASE_BEHAVIOR	startBehavior;			// how the corner behaves if the start point at the corner
		CORNER_END_CASE_BEHAVIOR	endBehavior;			// how the corner behaves if the end point at the corner
	} corners[] =
	{
		{ tcu::Vector<deInt64,2>(0,				-halfPixel),	false,	DiamondCorners::CORNER_EDGE_CASE_HIT_SECOND_QUARTER,	DiamondCorners::CORNER_START_CASE_POSITIVE_Y_45,	DiamondCorners::CORNER_END_CASE_DIRECTION_AND_SECOND_QUARTER},
		{ tcu::Vector<deInt64,2>(-halfPixel,	0),				false,	DiamondCorners::CORNER_EDGE_CASE_NONE,					DiamondCorners::CORNER_START_CASE_NONE,				DiamondCorners::CORNER_END_CASE_DIRECTION					},
		{ tcu::Vector<deInt64,2>(0,				halfPixel),		false,	DiamondCorners::CORNER_EDGE_CASE_HIT_FIRST_QUARTER,		DiamondCorners::CORNER_START_CASE_NEGATIVE_Y_45,	DiamondCorners::CORNER_END_CASE_DIRECTION_AND_FIRST_QUARTER	},
		{ tcu::Vector<deInt64,2>(halfPixel,		0),				true,	DiamondCorners::CORNER_EDGE_CASE_HIT,					DiamondCorners::CORNER_START_CASE_OUTSIDE,			DiamondCorners::CORNER_END_CASE_NONE						},
	};

	// Corner cases at the corners
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(corners); ++ndx)
	{
		const tcu::Vector<deInt64,2> p	= diamondCenter + corners[ndx].dp;
		const bool intersectsAtCorner	= LineRasterUtil::vertexOnLineSegment(p, line);

		if (!intersectsAtCorner)
			continue;

		// line segment body intersects with the corner
		if (p != line.m_v0 && p != line.m_v1)
		{
			if (corners[ndx].lineBehavior == DiamondCorners::CORNER_EDGE_CASE_HIT)
				return true;

			// endpoint in (+X, -Y) (X or Y may be 0) direction <==> x*y <= 0
			if (corners[ndx].lineBehavior == DiamondCorners::CORNER_EDGE_CASE_HIT_FIRST_QUARTER &&
				(line.direction().x() * line.direction().y()) <= 0)
				return true;

			// endpoint in (+X, +Y) (Y > 0) direction <==> x*y > 0
			if (corners[ndx].lineBehavior == DiamondCorners::CORNER_EDGE_CASE_HIT_SECOND_QUARTER &&
				(line.direction().x() * line.direction().y()) > 0)
				return true;
		}

		// line exits the area at the corner
		if (lineInCornerAngleRange(line, corners[ndx].dp))
		{
			const bool startIsInside = corners[ndx].pointInclusive || p != line.m_v0;
			const bool endIsOutside = !corners[ndx].pointInclusive || p != line.m_v1;

			// starting point is inside the region and end endpoint is outside
			if (startIsInside && endIsOutside)
				return true;
		}

		// line end is at the corner
		if (p == line.m_v1)
		{
			if (corners[ndx].endBehavior == DiamondCorners::CORNER_END_CASE_DIRECTION ||
				corners[ndx].endBehavior == DiamondCorners::CORNER_END_CASE_DIRECTION_AND_FIRST_QUARTER ||
				corners[ndx].endBehavior == DiamondCorners::CORNER_END_CASE_DIRECTION_AND_SECOND_QUARTER)
			{
				// did the line intersect the region
				if (lineInCornerAngleRange(line, corners[ndx].dp))
					return true;
			}

			// due to the perturbed endpoint, lines at this the angle will cause and enter-exit pair
			if (corners[ndx].endBehavior == DiamondCorners::CORNER_END_CASE_DIRECTION_AND_FIRST_QUARTER &&
				line.direction().x() < 0 &&
				line.direction().y() > 0)
				return true;
			if (corners[ndx].endBehavior == DiamondCorners::CORNER_END_CASE_DIRECTION_AND_SECOND_QUARTER &&
				line.direction().x() > 0 &&
				line.direction().y() > 0)
				return true;
		}

		// line start is at the corner
		if (p == line.m_v0)
		{
			if (corners[ndx].startBehavior == DiamondCorners::CORNER_START_CASE_OUTSIDE)
			{
				// if the line is not going inside, it will exit
				if (lineInCornerOutsideAngleRange(line, corners[ndx].dp))
					return true;
			}

			// exit, if line the angle between line vector and X-axis is in range (0, 45] in positive Y side.
			if (corners[ndx].startBehavior == DiamondCorners::CORNER_START_CASE_POSITIVE_Y_45 &&
				line.direction().x() > 0 &&
				line.direction().y() > 0 &&
				line.direction().y() <= line.direction().x())
				return true;

			// exit, if line the angle between line vector and X-axis is in range [0, 45] in negative Y side.
			if (corners[ndx].startBehavior == DiamondCorners::CORNER_START_CASE_NEGATIVE_Y_45 &&
				 line.direction().x() > 0 &&
				 line.direction().y() <= 0 &&
				-line.direction().y() <= line.direction().x())
				return true;
		}
	}

	// Does the line intersect boundary at the left == exits the diamond
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(bounds); ++ndx)
	{
		const bool startVertexInside =	LineRasterUtil::vertexOnLeftSideOfLine						(line.m_v0, LineRasterUtil::SubpixelLineSegment(bounds[ndx].p0, bounds[ndx].p1)) ||
										(bounds[ndx].edgeInclusive && LineRasterUtil::vertexOnLine	(line.m_v0, LineRasterUtil::SubpixelLineSegment(bounds[ndx].p0, bounds[ndx].p1)));
		const bool endVertexInside =	LineRasterUtil::vertexOnLeftSideOfLine						(line.m_v1, LineRasterUtil::SubpixelLineSegment(bounds[ndx].p0, bounds[ndx].p1)) ||
										(bounds[ndx].edgeInclusive && LineRasterUtil::vertexOnLine	(line.m_v1, LineRasterUtil::SubpixelLineSegment(bounds[ndx].p0, bounds[ndx].p1)));

		// start must be on inside this half space (left or at the inclusive boundary)
		if (!startVertexInside)
			continue;

		// end must be outside of this half-space (right or at non-inclusive boundary)
		if (endVertexInside)
			continue;

		// Does the line via v0 and v1 intersect the line segment p0-p1
		// <==> p0 and p1 are the different sides (LEFT, RIGHT) of the v0-v1 line.
		// Corners are not allowed, they are checked already
		LineRasterUtil::LINE_SIDE sideP0 = LineRasterUtil::getVertexSide(bounds[ndx].p0, line);
		LineRasterUtil::LINE_SIDE sideP1 = LineRasterUtil::getVertexSide(bounds[ndx].p1, line);

		if (sideP0 != LineRasterUtil::LINE_SIDE_INTERSECT &&
			sideP1 != LineRasterUtil::LINE_SIDE_INTERSECT &&
			sideP0 != sideP1)
			return true;
	}

	return false;
}